

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  uint *puVar1;
  Status stat;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int32_t iVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_58;
  
  stat = ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.stat)->data[i];
  if (this->theRep * stat < 1) {
    test(&local_58,this,i,stat);
    pnVar2 = (this->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar2[i].m_backend.data + 0x20) =
         local_58.m_backend.data._M_elems._32_8_;
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_58.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_58.m_backend.data._M_elems._24_8_;
    *(undefined8 *)&pnVar2[i].m_backend.data = local_58.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8) = local_58.m_backend.data._M_elems._8_8_;
    pnVar2[i].m_backend.exp = local_58.m_backend.exp;
    pnVar2[i].m_backend.neg = local_58.m_backend.neg;
    pnVar2[i].m_backend.fpclass = local_58.m_backend.fpclass;
    pnVar2[i].m_backend.prec_elem = local_58.m_backend.prec_elem;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar2[i].m_backend.data + 0x20);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
    uVar3 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = *(undefined8 *)puVar1;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar3;
    uVar3 = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8);
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
         *(undefined8 *)&pnVar2[i].m_backend.data;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar3;
    (__return_storage_ptr__->m_backend).exp = local_58.m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = local_58.m_backend.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_58.m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_58.m_backend.prec_elem;
  }
  else {
    pnVar2 = (this->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar2[i].m_backend,0);
    uVar3 = *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
    uVar4 = *(undefined8 *)puVar1;
    uVar5 = *(undefined8 *)(puVar1 + 2);
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
         *(undefined8 *)&pnVar2[i].m_backend.data;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) = uVar4;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar5;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         *(undefined8 *)((long)&pnVar2[i].m_backend.data + 0x20);
    (__return_storage_ptr__->m_backend).exp = pnVar2[i].m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = pnVar2[i].m_backend.neg;
    iVar6 = pnVar2[i].m_backend.prec_elem;
    (__return_storage_ptr__->m_backend).fpclass = pnVar2[i].m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = iVar6;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::computeTest(int i)
{
   typename SPxBasisBase<R>::Desc::Status stat = this->desc().status(i);

   if(isBasic(stat))
      return theTest[i] = 0;
   else
      return theTest[i] = test(i, stat);
}